

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_conversions1.cpp
# Opt level: O0

void __thiscall
Temperature_ConversionsUnitPreciseUnit2Precise_Test::
~Temperature_ConversionsUnitPreciseUnit2Precise_Test
          (Temperature_ConversionsUnitPreciseUnit2Precise_Test *this)

{
  Temperature_ConversionsUnitPreciseUnit2Precise_Test *this_local;
  
  ~Temperature_ConversionsUnitPreciseUnit2Precise_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Temperature, ConversionsUnitPreciseUnit2Precise)
{
    using namespace units;
    EXPECT_NEAR(
        convert(neg_forty_C, degC, precise::degF),
        neg_forty_C_in_F,
        test::precise_tolerance);
    EXPECT_NEAR(
        convert(neg_forty_C, degC, precise::K),
        neg_forty_C_in_K,
        test::precise_tolerance);

    EXPECT_NEAR(
        convert(neg_forty_C_in_F, degF, precise::degC),
        neg_forty_C,
        test::precise_tolerance);
    EXPECT_NEAR(
        convert(neg_forty_C_in_K, K, precise::degC),
        neg_forty_C,
        test::precise_tolerance);
    EXPECT_NEAR(
        convert(neg_forty_C_in_K, K, precise::degF),
        neg_forty_C_in_F,
        test::precise_tolerance);

    EXPECT_NEAR(
        convert(zero_C, degC, precise::degF),
        zero_C_in_F,
        test::precise_tolerance);
    EXPECT_NEAR(
        convert(zero_C, degC, precise::K),
        zero_C_in_K,
        test::precise_tolerance);

    EXPECT_NEAR(
        convert(zero_C_in_F, degF, precise::degC),
        zero_C,
        test::precise_tolerance);
    EXPECT_NEAR(
        convert(zero_C_in_K, K, precise::degC),
        zero_C,
        test::precise_tolerance);
    EXPECT_NEAR(
        convert(zero_C_in_K, K, precise::degF),
        zero_C_in_F,
        test::precise_tolerance);

    EXPECT_NEAR(
        convert(five_C, degC, precise::degF),
        five_C_in_F,
        test::precise_tolerance);
    EXPECT_NEAR(
        convert(five_C, degC, precise::K),
        five_C_in_K,
        test::precise_tolerance);

    EXPECT_NEAR(
        convert(five_C_in_F, degF, precise::degC),
        five_C,
        test::precise_tolerance);
    EXPECT_NEAR(
        convert(five_C_in_K, K, precise::degC),
        five_C,
        test::precise_tolerance);
    EXPECT_NEAR(
        convert(five_C_in_K, K, precise::degF),
        five_C_in_F,
        test::precise_tolerance);

    EXPECT_NEAR(
        convert(hundred_C, degC, precise::degF),
        hundred_C_in_F,
        test::precise_tolerance);
    EXPECT_NEAR(
        convert(hundred_C, degC, precise::K),
        hundred_C_in_K,
        test::precise_tolerance);

    EXPECT_NEAR(
        convert(hundred_C_in_F, degF, precise::degC),
        hundred_C,
        test::precise_tolerance);
    EXPECT_NEAR(
        convert(hundred_C_in_K, K, precise::degC),
        hundred_C,
        test::precise_tolerance);
    EXPECT_NEAR(
        convert(hundred_C_in_K, K, precise::degF),
        hundred_C_in_F,
        test::precise_tolerance);
}